

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psft.c
# Opt level: O1

FT_Error cf2_decoder_parse_charstrings
                   (PS_Decoder *decoder,FT_Byte *charstring_base,FT_ULong charstring_len)

{
  char cVar1;
  char cVar2;
  FT_Bool FVar3;
  FT_Bool FVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  ushort uVar8;
  FT_Face pFVar9;
  FT_Driver pFVar10;
  CFF_GlyphSlot pCVar11;
  FT_Memory memory;
  PS_Decoder *pPVar12;
  CFF_SubFont pCVar13;
  FT_Service_CFFLoad pFVar14;
  FT_Pos FVar15;
  FT_Int *darkenParams;
  undefined4 uVar16;
  undefined1 auVar17 [16];
  FT_Bool FVar18;
  uint uVar19;
  int iVar20;
  CF2_Font font;
  FT_Long FVar21;
  CF2_BlueRec *pCVar22;
  ulong uVar23;
  int iVar24;
  long lVar25;
  FT_Error FVar26;
  uint uVar27;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  FT_Bool FVar31;
  CF2_F16Dot16 CVar32;
  ulong uVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  uint uVar37;
  int iVar38;
  int iVar39;
  bool bVar40;
  undefined1 auVar41 [16];
  FT_UFast lenNormalizedV;
  FT_Error error;
  CF2_F16Dot16 advWidth;
  FT_Fixed *normalizedV;
  CF2_Matrix transform;
  CF2_BufferRec buf;
  FT_Vector translation;
  FT_UFast local_ac;
  CF2_BlueRec *local_a8;
  FT_Int *local_a0;
  FT_Error local_98;
  CF2_F16Dot16 local_94;
  FT_Fixed *local_90;
  undefined1 local_88 [5];
  char cStack_83;
  char cStack_82;
  char cStack_81;
  undefined8 uStack_80;
  undefined8 local_78;
  int local_6c;
  undefined1 local_68 [16];
  FT_Byte *local_58;
  FT_Byte *pFStack_50;
  FT_Vector local_40;
  
  local_98 = 0;
  FVar18 = (decoder->builder).is_t1;
  if ((FVar18 != '\0') && (decoder->current_subfont == (CFF_SubFont)0x0)) {
    return 8;
  }
  font = (CF2_Font)decoder->cf2_instance->data;
  if (font == (CF2_Font)0x0) {
    memory = (decoder->builder).memory;
    decoder->cf2_instance->finalizer = cf2_free_instance;
    font = (CF2_Font)ft_mem_alloc(memory,0x290,&local_98);
    decoder->cf2_instance->data = font;
    if (local_98 != 0) {
      return 0x40;
    }
    font->memory = memory;
    if (FVar18 == '\0') {
      font->cffload = (FT_Service_CFFLoad)decoder->cff->cffload;
    }
    (font->outline).root.windingMomentum = 0;
    *(undefined4 *)&(font->outline).root.field_0x24 = 0;
    (font->outline).root.memory = (FT_Memory)0x0;
    *(undefined1 (*) [16])&(font->outline).root.error = (undefined1  [16])0x0;
    (font->outline).root.moveTo = (CF2_Callback_Type)0x0;
    (font->outline).root.lineTo = (CF2_Callback_Type)0x0;
    (font->outline).root.quadTo = (CF2_Callback_Type)0x0;
    (font->outline).root.cubeTo = (CF2_Callback_Type)0x0;
    (font->outline).root.memory = memory;
    (font->outline).root.error = &font->error;
    (font->outline).root.moveTo = cf2_builder_moveTo;
    (font->outline).root.lineTo = cf2_builder_lineTo;
    (font->outline).root.cubeTo = cf2_builder_cubeTo;
  }
  font->decoder = decoder;
  (font->outline).decoder = decoder;
  pFVar9 = (decoder->builder).face;
  pFVar10 = pFVar9->driver;
  cVar1 = *(char *)((long)&pFVar10[1].root.clazz + 4);
  cVar2 = pFVar9->internal->no_stem_darkening;
  local_68._8_8_ = 0;
  local_68._0_8_ = charstring_base;
  local_68 = local_68 << 0x40;
  local_58 = charstring_base + charstring_len;
  if (charstring_base == (FT_Byte *)0x0) {
    local_58 = (FT_Byte *)0x0;
  }
  pFStack_50 = charstring_base;
  local_78 = 0;
  pCVar11 = (decoder->builder).glyph;
  FVar3 = pCVar11->hint;
  stack0xffffffffffffff7c = SUB1612((undefined1  [16])0x0,4);
  if (FVar3 == '\0') {
    local_88._0_4_ = 0x400;
    iVar39 = 0x400;
  }
  else {
    iVar34 = (int)pCVar11->x_scale;
    iVar39 = iVar34 + 0x20;
    iVar34 = iVar34 + 0x5f;
    if (-1 < iVar39) {
      iVar34 = iVar39;
    }
    local_88._0_4_ = iVar34 >> 6;
    iVar39 = (int)pCVar11->y_scale;
    iVar34 = iVar39 + 0x20;
    iVar39 = iVar39 + 0x5f;
    if (-1 < iVar34) {
      iVar39 = iVar34;
    }
    iVar39 = iVar39 >> 6;
  }
  FVar4 = pCVar11->scaled;
  uStack_80._4_4_ = iVar39;
  auVar17 = _local_88;
  if (FVar18 == '\0') {
    FVar31 = *(FT_Bool *)&pFVar9[4].autohint.data;
  }
  else {
    FVar31 = '\0';
  }
  font->isCFF2 = FVar31;
  font->isT1 = FVar18;
  uVar19 = (uint)(FVar3 != '\0');
  font->renderingFlags = uVar19;
  if ((FVar4 != '\0') && ((cVar2 == '\0' || ((cVar2 < '\0' && (cVar1 == '\0')))))) {
    font->renderingFlags = uVar19 | 2;
  }
  font->darkenParams[0] = *(FT_Int *)&pFVar10[1].root.library;
  font->darkenParams[1] = *(FT_Int *)((long)&pFVar10[1].root.library + 4);
  font->darkenParams[2] = *(FT_Int *)&pFVar10[1].root.memory;
  font->darkenParams[3] = *(FT_Int *)((long)&pFVar10[1].root.memory + 4);
  font->darkenParams[4] = *(FT_Int *)&pFVar10[1].clazz;
  font->darkenParams[5] = *(FT_Int *)((long)&pFVar10[1].clazz + 4);
  font->darkenParams[6] = *(FT_Int *)&pFVar10[1].faces_list.head;
  font->darkenParams[7] = *(FT_Int *)((long)&pFVar10[1].faces_list.head + 4);
  uVar8 = ((decoder->builder).face)->units_per_EM;
  font->unitsPerEm = (uint)uVar8;
  if (FVar4 != '\0') {
    uVar16 = local_88._0_4_;
    iVar34 = 0x24;
    bVar40 = 0 < (int)local_88._0_4_;
    _local_88 = auVar17;
    if (((bVar40) && (0 < iVar39)) && (iVar34 = 0xa4, -1 < (short)uVar8)) {
      FVar21 = FT_DivFix(0x7d00000,(ulong)uVar8 << 0x10);
      if (((int)uVar16 <= (int)FVar21) && (iVar34 = 0xa4, iVar39 <= (int)FVar21)) {
        iVar34 = 0;
      }
    }
    if (iVar34 != 0) {
      return iVar34;
    }
  }
  local_94 = 0;
  local_40.x = (FT_Pos)(int)local_78;
  local_40.y = (FT_Pos)local_78._4_4_;
  pPVar12 = font->decoder;
  pCVar22 = (CF2_BlueRec *)(ulong)(uint)font->syntheticEmboldeningAmountX;
  CVar32 = font->syntheticEmboldeningAmountY;
  local_ac = 0;
  local_90 = (FT_Fixed *)0x0;
  font->error = 0;
  pCVar13 = pPVar12->current_subfont;
  bVar40 = font->lastSubfont != pCVar13;
  if (bVar40) {
    font->lastSubfont = pCVar13;
  }
  if ((font->isT1 == '\0') && ((pPVar12->cff->vstore).dataCount != 0)) {
    pFVar14 = font->cffload;
    pFVar9 = (pPVar12->builder).face;
    local_a8 = pCVar22;
    iVar39 = (*(code *)(pFVar9[3].glyph)->linearVertAdvance)(pFVar9,&local_ac,0,&local_90);
    font->error = iVar39;
    if (iVar39 == 0) {
      FVar18 = (*pFVar14->blend_check_vector)
                         (&pCVar13->blend,(pCVar13->private_dict).vsindex,local_ac,local_90);
      if (FVar18 != '\0') {
        (*pFVar14->load_private_dict)(pPVar12->cff,pCVar13,local_ac,local_90);
      }
      bVar40 = FVar18 != '\0' || bVar40;
      (font->blend).font = (pCVar13->blend).font;
      (font->blend).usedBV = '\0';
      font->vsindex = (pCVar13->private_dict).vsindex;
      font->lenNDV = local_ac;
      font->NDV = local_90;
    }
    pCVar22 = local_a8;
    if (iVar39 != 0) goto LAB_0023317c;
  }
  auVar17 = _local_88;
  iVar39 = (uint)(((pPVar12->builder).face)->size->metrics).y_ppem << 0x10;
  if (font->ppem != iVar39) {
    font->ppem = iVar39;
    bVar40 = true;
  }
  uVar19 = font->renderingFlags;
  font->hinted = (byte)uVar19 & 1;
  auVar41[0] = -((char)(font->currentTransform).a == local_88[0]);
  auVar41[1] = -(*(char *)((long)&(font->currentTransform).a + 1) == local_88[1]);
  auVar41[2] = -(*(char *)((long)&(font->currentTransform).a + 2) == local_88[2]);
  auVar41[3] = -(*(char *)((long)&(font->currentTransform).a + 3) == local_88[3]);
  auVar41[4] = -((char)(font->currentTransform).b == local_88[4]);
  auVar41[5] = -(*(char *)((long)&(font->currentTransform).b + 1) == cStack_83);
  auVar41[6] = -(*(char *)((long)&(font->currentTransform).b + 2) == cStack_82);
  auVar41[7] = -(*(char *)((long)&(font->currentTransform).b + 3) == cStack_81);
  auVar41[8] = -((char)(font->currentTransform).c == (char)uStack_80);
  auVar41[9] = -(*(char *)((long)&(font->currentTransform).c + 1) == uStack_80._1_1_);
  auVar41[10] = -(*(char *)((long)&(font->currentTransform).c + 2) == uStack_80._2_1_);
  auVar41[0xb] = -(*(char *)((long)&(font->currentTransform).c + 3) == uStack_80._3_1_);
  auVar41[0xc] = -((char)(font->currentTransform).d == uStack_80._4_1_);
  auVar41[0xd] = -(*(char *)((long)&(font->currentTransform).d + 1) == uStack_80._5_1_);
  auVar41[0xe] = -(*(char *)((long)&(font->currentTransform).d + 2) == uStack_80._6_1_);
  auVar41[0xf] = -(*(char *)((long)&(font->currentTransform).d + 3) == uStack_80._7_1_);
  if ((ushort)((ushort)(SUB161(auVar41 >> 7,0) & 1) | (ushort)(SUB161(auVar41 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar41 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar41 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar41 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar41 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar41 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar41 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar41 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar41 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar41 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar41 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar41 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar41 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar41 >> 0x77,0) & 1) << 0xe | (ushort)(auVar41[0xf] >> 7) << 0xf)
      != 0xffff) {
    (font->currentTransform).tx = (int)local_78;
    (font->currentTransform).ty = local_78._4_4_;
    (font->currentTransform).a = local_88._0_4_;
    (font->currentTransform).b = stack0xffffffffffffff7c;
    (font->currentTransform).c = (undefined4)uStack_80;
    (font->currentTransform).d = uStack_80._4_4_;
    (font->currentTransform).tx = 0;
    (font->currentTransform).ty = 0;
    (font->innerTransform).a = local_88._0_4_;
    (font->innerTransform).b = stack0xffffffffffffff7c;
    (font->innerTransform).c = (undefined4)uStack_80;
    (font->innerTransform).d = uStack_80._4_4_;
    (font->innerTransform).tx = (int)local_78;
    (font->innerTransform).ty = local_78._4_4_;
    (font->outerTransform).a = 0x10000;
    (font->outerTransform).b = 0;
    (font->outerTransform).c = 0;
    (font->outerTransform).d = 0x10000;
    bVar40 = true;
  }
  uVar19 = uVar19 & 2;
  if (uVar19 != font->stemDarkened) {
    font->stemDarkened = (FT_Bool)(uVar19 >> 1);
    bVar40 = true;
  }
  _local_88 = auVar17;
  if (!bVar40) goto LAB_0023317c;
  iVar39 = 1000;
  if (font->unitsPerEm != 0) {
    iVar39 = font->unitsPerEm;
  }
  uVar19 = 0x40000;
  if (0x40000 < font->ppem) {
    uVar19 = font->ppem;
  }
  iVar34 = (int)(pPVar12->current_subfont->private_dict).standard_height;
  font->stdVW = iVar34 << 0x10;
  iVar36 = (int)(0x3e80000 / (long)iVar39);
  local_a8 = (CF2_BlueRec *)(long)iVar36;
  if (iVar34 << 0x10 < 1) {
    FVar21 = FT_DivFix(0x4b0000,(FT_Long)local_a8);
    font->stdVW = (CF2_F16Dot16)FVar21;
  }
  local_a0 = font->darkenParams;
  if ((int)pCVar22 < 1) {
    cf2_computeDarkening(iVar36,uVar19,font->stdVW,&font->darkenX,0,font->stemDarkened,local_a0);
  }
  else {
    local_6c = iVar36;
    FVar21 = FT_DivFix((long)(iVar39 << 0x10),(ulong)uVar19);
    if ((long)pCVar22 <= FVar21) {
      pCVar22 = (CF2_BlueRec *)FT_DivFix((long)(iVar39 << 0x10),(ulong)uVar19);
    }
    font->darkenX = 0;
    iVar36 = local_6c;
    if ((0x28e < local_6c) && ((int)pCVar22 != 0)) {
      font->darkenX = (int)(((uint)((ulong)pCVar22 >> 0x1f) & 1) + (int)pCVar22) >> 1;
    }
  }
  FVar15 = (pPVar12->current_subfont->private_dict).standard_width;
  if ((short)FVar15 < 1) {
LAB_00232c45:
    FVar21 = 0x6e0000;
  }
  else {
    iVar34 = (int)FVar15;
    iVar20 = iVar34 * 0x20000;
    FVar21 = 0x4b0000;
    iVar39 = font->stdVW;
    if (iVar39 == iVar20 || SBORROW4(iVar39,iVar20) != iVar39 + iVar34 * -0x20000 < 0)
    goto LAB_00232c45;
  }
  FVar21 = FT_DivFix(FVar21,(FT_Long)local_a8);
  darkenParams = local_a0;
  font->stdHW = (CF2_F16Dot16)FVar21;
  local_a0 = &font->darkenY;
  cf2_computeDarkening
            (iVar36,uVar19,(CF2_F16Dot16)FVar21,local_a0,CVar32,font->stemDarkened,darkenParams);
  bVar40 = true;
  if (font->darkenX == 0) {
    bVar40 = *local_a0 != 0;
  }
  font->darkened = bVar40;
  font->reverseWinding = '\0';
  pPVar12 = font->decoder;
  uVar19 = 0;
  memset(&font->blues,0,0x150);
  (font->blues).scale = (font->innerTransform).d;
  FVar21 = FT_DivFix((pPVar12->current_subfont->private_dict).blue_scale,0x3e80000);
  (font->blues).blueScale = (CF2_F16Dot16)FVar21;
  pCVar13 = pPVar12->current_subfont;
  (font->blues).blueShift = (int)(pCVar13->private_dict).blue_shift << 0x10;
  (font->blues).blueFuzz = (int)(pCVar13->private_dict).blue_fuzz << 0x10;
  bVar5 = (pCVar13->private_dict).num_blue_values;
  uVar28 = (ulong)bVar5;
  uVar23 = (ulong)(pCVar13->private_dict).num_other_blues;
  bVar6 = (pCVar13->private_dict).num_family_blues;
  bVar7 = (pCVar13->private_dict).num_family_other_blues;
  if ((pCVar13->private_dict).language_group == 1) {
    if (uVar28 != 0) {
      if (bVar5 != 4) goto LAB_00232e52;
      if ((((-0x79 < (short)(pCVar13->private_dict).blue_values[0]) ||
           (-0x79 < (short)(pCVar13->private_dict).blue_values[1])) ||
          ((short)(pCVar13->private_dict).blue_values[2] < 0x371)) ||
         ((short)(pCVar13->private_dict).blue_values[3] < 0x371)) goto LAB_00232e49;
    }
    (font->blues).emBoxBottomEdge.csCoord = -0x780001;
    iVar39 = (font->blues).scale;
    lVar25 = (long)iVar39 * -0x780001;
    (font->blues).emBoxBottomEdge.dsCoord =
         ((int)((ulong)(lVar25 + 0x8000 + (lVar25 >> 0x3f)) >> 0x10) + 0x8000U & 0xffff0000) -
         0x8000;
    (font->blues).emBoxBottomEdge.scale = iVar39;
    (font->blues).emBoxBottomEdge.flags = 0x31;
    lVar25 = (long)font->darkenY * 2 + 0x3700001;
    (font->blues).emBoxTopEdge.csCoord = (CF2_F16Dot16)lVar25;
    lVar25 = lVar25 * iVar39;
    (font->blues).emBoxTopEdge.dsCoord =
         (int)((ulong)(lVar25 + 0x8000 + (lVar25 >> 0x3f)) >> 0x10) + 0x8000U & 0xffff0000 | 0x8000;
    (font->blues).emBoxTopEdge.scale = iVar39;
    (font->blues).emBoxTopEdge.flags = 0x32;
    (font->blues).doEmBoxHints = '\x01';
  }
  else {
LAB_00232e49:
    if (uVar28 != 0) {
LAB_00232e52:
      uVar33 = (ulong)(font->blues).count;
      uVar19 = 0;
      uVar29 = 0;
      uVar27 = uVar19;
      do {
        iVar39 = (int)(pCVar13->private_dict).blue_values[uVar29];
        iVar34 = iVar39 * 0x10000;
        (font->blues).zone[uVar33].csBottomEdge = iVar34;
        CVar32 = (int)(pCVar13->private_dict).blue_values[uVar29 + 1] * 0x10000;
        (font->blues).zone[uVar33].csTopEdge = CVar32;
        uVar37 = CVar32 + iVar39 * -0x10000;
        if (-1 < (int)uVar37) {
          pCVar22 = (font->blues).zone + uVar33;
          bVar40 = (int)uVar19 < (int)uVar37;
          uVar19 = uVar27;
          if (bVar40) {
            uVar19 = uVar37;
          }
          if (uVar29 != 0) {
            iVar39 = *local_a0;
            (font->blues).zone[uVar33].csTopEdge = CVar32 + iVar39 * 2;
            CVar32 = iVar34 + iVar39 * 2;
            pCVar22->csBottomEdge = CVar32;
          }
          (font->blues).zone[uVar33].bottomZone = uVar29 == 0;
          pCVar22->csFlatEdge = CVar32;
          uVar27 = (int)uVar33 + 1;
          uVar33 = (ulong)uVar27;
          (font->blues).count = uVar27;
          uVar27 = uVar19;
        }
        uVar29 = uVar29 + 2;
      } while (uVar29 < uVar28);
    }
    if (uVar23 != 0) {
      uVar27 = (font->blues).count;
      uVar28 = 0;
      do {
        iVar39 = (int)(pCVar13->private_dict).other_blues[uVar28];
        (font->blues).zone[uVar27].csBottomEdge = iVar39 * 0x10000;
        iVar34 = (int)(pCVar13->private_dict).other_blues[uVar28 + 1] * 0x10000;
        (font->blues).zone[uVar27].csTopEdge = iVar34;
        uVar37 = iVar34 + iVar39 * -0x10000;
        if (-1 < (int)uVar37) {
          if ((int)uVar19 < (int)uVar37) {
            uVar19 = uVar37;
          }
          (font->blues).zone[uVar27].bottomZone = '\x01';
          (font->blues).zone[uVar27].csFlatEdge = iVar34;
          uVar27 = uVar27 + 1;
          (font->blues).count = uVar27;
        }
        uVar28 = uVar28 + 2;
      } while (uVar28 < uVar23);
    }
    FVar21 = FT_DivFix(0x10000,(long)(font->blues).scale);
    uVar23 = (ulong)(font->blues).count;
    if (uVar23 != 0) {
      local_a8 = (font->blues).zone;
      uVar28 = 0;
      do {
        iVar39 = local_a8[uVar28].csFlatEdge;
        iVar34 = (int)FVar21;
        if (local_a8[uVar28].bottomZone == '\0') {
          if (2 < bVar6) {
            iVar36 = *local_a0;
            iVar20 = 0x7fffffff;
            lVar25 = 0x44;
            do {
              iVar38 = (&(pCVar13->font_dict).version)[lVar25 * 2] * 0x10000 + iVar36 * 2;
              iVar35 = iVar39 - iVar38;
              iVar24 = -iVar35;
              if (0 < iVar35) {
                iVar24 = iVar35;
              }
            } while ((((iVar20 <= iVar24) || (iVar34 <= iVar24)) ||
                     (local_a8[uVar28].csFlatEdge = iVar38, iVar20 = iVar24, iVar39 != iVar38)) &&
                    (uVar33 = lVar25 - 0x40, lVar25 = lVar25 + 2, uVar33 < bVar6));
          }
        }
        else {
          iVar36 = 0x7fffffff;
          if (bVar7 != 0) {
            uVar33 = 0;
            do {
              iVar20 = (int)(pCVar13->private_dict).family_other_blues[uVar33 + 1];
              iVar35 = iVar20 * 0x10000;
              iVar24 = iVar39 + iVar20 * -0x10000;
              iVar20 = -iVar24;
              if (0 < iVar24) {
                iVar20 = iVar24;
              }
              if (((iVar20 < iVar36) && (iVar20 < iVar34)) &&
                 (local_a8[uVar28].csFlatEdge = iVar35, iVar36 = iVar20, iVar39 == iVar35)) {
                iVar36 = 0;
                break;
              }
              uVar33 = uVar33 + 2;
            } while (uVar33 < bVar7);
          }
          if (1 < bVar6) {
            iVar20 = (int)(pCVar13->private_dict).family_blues[1];
            iVar39 = iVar39 + iVar20 * -0x10000;
            iVar24 = -iVar39;
            if (0 < iVar39) {
              iVar24 = iVar39;
            }
            if ((iVar24 < iVar36) && (iVar24 < iVar34)) {
              local_a8[uVar28].csFlatEdge = iVar20 * 0x10000;
            }
          }
        }
        uVar28 = uVar28 + 1;
      } while (uVar28 != uVar23);
    }
    if (0 < (int)uVar19) {
      iVar39 = (font->blues).blueScale;
      FVar21 = FT_DivFix(0x10000,(ulong)uVar19);
      if (FVar21 < iVar39) {
        FVar21 = FT_DivFix(0x10000,(ulong)uVar19);
        (font->blues).blueScale = (CF2_F16Dot16)FVar21;
      }
    }
    iVar39 = (font->blues).scale;
    iVar34 = (font->blues).blueScale;
    if (iVar39 < iVar34) {
      (font->blues).suppressOvershoot = '\x01';
      FVar21 = FT_MulDiv(0x999a,(long)iVar39,(long)iVar34);
      iVar39 = 0x999a - (int)FVar21;
      if (0x7ffe < iVar39) {
        iVar39 = 0x7fff;
      }
      (font->blues).boost = iVar39;
    }
    if (font->stemDarkened != '\0') {
      (font->blues).boost = 0;
    }
    uVar23 = (ulong)(font->blues).count;
    if (uVar23 != 0) {
      iVar39 = (font->blues).scale;
      iVar34 = (font->blues).boost;
      lVar25 = 0;
      do {
        lVar30 = (long)*(int *)((long)&(font->blues).zone[0].csFlatEdge + lVar25) * (long)iVar39;
        iVar36 = (int)((ulong)(lVar30 + (lVar30 >> 0x3f) + 0x8000) >> 0x10);
        uVar19 = (iVar36 - iVar34) + 0x8000;
        if ((&(font->blues).zone[0].bottomZone)[lVar25] == '\0') {
          uVar19 = iVar34 + 0x8000 + iVar36;
        }
        *(uint *)((long)&(font->blues).zone[0].dsFlatEdge + lVar25) = uVar19 & 0xffff0000;
        lVar25 = lVar25 + 0x14;
      } while (uVar23 * 0x14 != lVar25);
    }
  }
LAB_0023317c:
  if (font->error == 0) {
    font->reverseWinding = '\0';
    bVar40 = font->darkened == '\0';
    while( true ) {
      pPVar12 = (font->outline).decoder;
      (font->outline).root.windingMomentum = 0;
      FT_GlyphLoader_Rewind((pPVar12->builder).loader);
      cf2_interpT2CharString
                (font,(CF2_Buffer)local_68,&(font->outline).root,&local_40,'\0',0,0,&local_94);
      if (font->error != 0) break;
      if ((bVar40) || (-1 < (font->outline).root.windingMomentum)) {
        pPVar12 = (font->outline).decoder;
        ps_builder_close_contour(&pPVar12->builder);
        FT_GlyphLoader_Add((pPVar12->builder).loader);
        break;
      }
      font->reverseWinding = '\x01';
      bVar40 = true;
    }
  }
  if (font->error == 0) {
    font->error = 0;
  }
  FVar26 = 3;
  if (font->error == 0) {
    pPVar12 = (font->outline).decoder;
    FVar26 = 0;
    if ((pPVar12->builder).is_t1 == '\0') {
      *pPVar12->glyph_width = (long)(short)((uint)(local_94 + 0x8000) >> 0x10);
      FVar26 = 0;
    }
  }
  return FVar26;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cf2_decoder_parse_charstrings( PS_Decoder*  decoder,
                                 FT_Byte*     charstring_base,
                                 FT_ULong     charstring_len )
  {
    FT_Memory  memory;
    FT_Error   error = FT_Err_Ok;
    CF2_Font   font;

    FT_Bool  is_t1 = decoder->builder.is_t1;


    FT_ASSERT( decoder &&
               ( is_t1 || decoder->cff ) );

    if ( is_t1 && !decoder->current_subfont )
    {
      FT_ERROR(( "cf2_decoder_parse_charstrings (Type 1): "
                 "SubFont missing. Use `t1_make_subfont' first\n" ));
      return FT_THROW( Invalid_Table );
    }

    memory = decoder->builder.memory;

    /* CF2 data is saved here across glyphs */
    font = (CF2_Font)decoder->cf2_instance->data;

    /* on first glyph, allocate instance structure */
    if ( !decoder->cf2_instance->data )
    {
      decoder->cf2_instance->finalizer =
        (FT_Generic_Finalizer)cf2_free_instance;

      if ( FT_ALLOC( decoder->cf2_instance->data,
                     sizeof ( CF2_FontRec ) ) )
        return FT_THROW( Out_Of_Memory );

      font = (CF2_Font)decoder->cf2_instance->data;

      font->memory = memory;

      if ( !is_t1 )
        font->cffload = (FT_Service_CFFLoad)decoder->cff->cffload;

      /* initialize a client outline, to be shared by each glyph rendered */
      cf2_outline_init( &font->outline, font->memory, &font->error );
    }

    /* save decoder; it is a stack variable and will be different on each */
    /* call                                                               */
    font->decoder         = decoder;
    font->outline.decoder = decoder;

    {
      /* build parameters for Adobe engine */

      PS_Builder*  builder = &decoder->builder;
      PS_Driver    driver  = (PS_Driver)FT_FACE_DRIVER( builder->face );

      FT_Bool  no_stem_darkening_driver =
                 driver->no_stem_darkening;
      FT_Char  no_stem_darkening_font =
                 builder->face->internal->no_stem_darkening;

      /* local error */
      FT_Error       error2 = FT_Err_Ok;
      CF2_BufferRec  buf;
      CF2_Matrix     transform;
      CF2_F16Dot16   glyphWidth;

      FT_Bool  hinted;
      FT_Bool  scaled;


      /* FreeType has already looked up the GID; convert to         */
      /* `RegionBuffer', assuming that the input has been validated */
      FT_ASSERT( charstring_base + charstring_len >= charstring_base );

      FT_ZERO( &buf );
      buf.start =
      buf.ptr   = charstring_base;
      buf.end   = FT_OFFSET( charstring_base, charstring_len );

      FT_ZERO( &transform );

      cf2_getScaleAndHintFlag( decoder,
                               &transform.a,
                               &transform.d,
                               &hinted,
                               &scaled );

      if ( is_t1 )
        font->isCFF2 = FALSE;
      else
      {
        /* copy isCFF2 boolean from TT_Face to CF2_Font */
        font->isCFF2 = ((TT_Face)builder->face)->is_cff2;
      }
      font->isT1 = is_t1;

      font->renderingFlags = 0;
      if ( hinted )
        font->renderingFlags |= CF2_FlagsHinted;
      if ( scaled && ( !no_stem_darkening_font        ||
                       ( no_stem_darkening_font < 0 &&
                         !no_stem_darkening_driver  ) ) )
        font->renderingFlags |= CF2_FlagsDarkened;

      font->darkenParams[0] = driver->darken_params[0];
      font->darkenParams[1] = driver->darken_params[1];
      font->darkenParams[2] = driver->darken_params[2];
      font->darkenParams[3] = driver->darken_params[3];
      font->darkenParams[4] = driver->darken_params[4];
      font->darkenParams[5] = driver->darken_params[5];
      font->darkenParams[6] = driver->darken_params[6];
      font->darkenParams[7] = driver->darken_params[7];

      /* now get an outline for this glyph;      */
      /* also get units per em to validate scale */
      font->unitsPerEm = (CF2_Int)cf2_getUnitsPerEm( decoder );

      if ( scaled )
      {
        error2 = cf2_checkTransform( &transform, font->unitsPerEm );
        if ( error2 )
          return error2;
      }

      error2 = cf2_getGlyphOutline( font, &buf, &transform, &glyphWidth );
      if ( error2 )
        return FT_ERR( Invalid_File_Format );

      cf2_setGlyphWidth( &font->outline, glyphWidth );

      return FT_Err_Ok;
    }
  }